

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
          (ShaderImageLoadStoreBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,
          char *src_fs,bool *result)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint GVar2;
  char *pcVar3;
  char *src_tcs_local;
  char *src_fs_local;
  char *src_gs_local;
  char *src_tes_local;
  char *src_vs_local;
  char *local_448;
  GLsizei length;
  GLint status;
  GLchar log [1024];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  src_tcs_local = src_tcs;
  src_fs_local = src_fs;
  src_gs_local = src_gs;
  src_tes_local = src_tes;
  src_vs_local = src_vs;
  local_448 = src_fs;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (src_vs == (char *)0x0) {
LAB_00a32160:
    if (src_tcs != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e88);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&src_tcs_local,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = src_tcs_local;
      if (!bVar1) goto LAB_00a32399;
    }
    if (src_tes != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e87);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&src_tes_local,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = src_tes_local;
      if (!bVar1) goto LAB_00a32399;
    }
    if (src_gs != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8dd9);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&src_gs_local,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = src_gs_local;
      if (!bVar1) goto LAB_00a32399;
    }
    if (local_448 != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&src_fs_local,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = src_fs_local;
      if (!bVar1) goto LAB_00a32399;
    }
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&status);
    if (status != 0) {
      return program;
    }
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,&length,log);
    if (1 < length) {
      anon_unknown_0::Output("Program Info Log:\n%s\n",log);
    }
    if (src_vs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (src_tcs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (src_tes_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (src_gs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    pcVar3 = src_fs_local;
    if (src_fs_local == (char *)0x0) goto LAB_00a323a7;
  }
  else {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&src_vs_local,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    src_tcs = src_tcs_local;
    pcVar3 = src_vs_local;
    if (bVar1) goto LAB_00a32160;
  }
LAB_00a32399:
  anon_unknown_0::Output("%s\n",pcVar3);
LAB_00a323a7:
  if (result != (bool *)0x0) {
    *result = false;
  }
  return program;
}

Assistant:

GLuint BuildProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						const char* src_fs, bool* result = NULL)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_vs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tcs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tes);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_gs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_fs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (src_vs)
				Output("%s\n", src_vs);
			if (src_tcs)
				Output("%s\n", src_tcs);
			if (src_tes)
				Output("%s\n", src_tes);
			if (src_gs)
				Output("%s\n", src_gs);
			if (src_fs)
				Output("%s\n", src_fs);
			if (result)
				*result = false;
			return p;
		}

		return p;
	}